

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorSpeed.cpp
# Opt level: O1

void __thiscall
chrono::ChShaftsMotorSpeed::IntStateGather
          (ChShaftsMotorSpeed *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double *T)

{
  if ((long)(ulong)off_x <
      (x->super_ChVectorDynamic<double>).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    (x->super_ChVectorDynamic<double>).
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[off_x] = 0.0;
    if ((long)(ulong)off_v <
        (v->super_ChVectorDynamic<double>).
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      (v->super_ChVectorDynamic<double>).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[off_v] =
           this->aux_dt;
      *T = (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj.
           ChTime;
      return;
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChShaftsMotorSpeed::IntStateGather(const unsigned int off_x,  // offset in x state vector
                             ChState& x,                // state vector, position part
                             const unsigned int off_v,  // offset in v state vector
                             ChStateDelta& v,           // state vector, speed part
                             double& T                  // time
                             ) {
    x(off_x) = 0;//aux;
    v(off_v) = aux_dt;
    T = GetChTime();
}